

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BristolCircuit.cpp
# Opt level: O1

void __thiscall Circuit::output_gate(Circuit *this,ostream *s,uint i)

{
  GateType GVar1;
  pointer pvVar2;
  bool bVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  
  GVar1 = (this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
          super__Vector_impl_data._M_start[i];
  if (GVar1 == EQW) {
    std::__ostream_insert<char,std::char_traits<char>>(s,"1 1 ",4);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    s = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    pcVar7 = " EQW";
  }
  else {
    if (GVar1 == EQ) {
      std::__ostream_insert<char,std::char_traits<char>>(s,"1 1 ",4);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      s = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      pcVar7 = " EQ";
      lVar5 = 3;
      goto LAB_0010498b;
    }
    if (GVar1 != INV) {
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      pvVar2 = (this->GateI).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar2[i].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data + 8) !=
          pvVar2[i].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar6 = 1;
        do {
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)s);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          pvVar2 = (this->GateI).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          bVar3 = uVar6 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar2[i].
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                  *(long *)&pvVar2[i].
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data >> 2);
          uVar6 = (ulong)((int)uVar6 + 1);
        } while (bVar3);
      }
      pvVar2 = (this->GateO).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar2[i].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data + 8) !=
          pvVar2[i].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar6 = 1;
        do {
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)s);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          pvVar2 = (this->GateO).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          bVar3 = uVar6 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar2[i].
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                  *(long *)&pvVar2[i].
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data >> 2);
          uVar6 = (ulong)((int)uVar6 + 1);
        } while (bVar3);
      }
      GVar1 = (this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
              super__Vector_impl_data._M_start[i];
      if (GVar1 == AND) {
        pcVar7 = "AND";
      }
      else {
        if (GVar1 == MAND) {
          pcVar7 = "MAND";
          lVar5 = 4;
          goto LAB_0010498b;
        }
        pcVar7 = "XOR";
      }
      lVar5 = 3;
      goto LAB_0010498b;
    }
    std::__ostream_insert<char,std::char_traits<char>>(s,"1 1 ",4);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    s = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    pcVar7 = " INV";
  }
  lVar5 = 4;
LAB_0010498b:
  std::__ostream_insert<char,std::char_traits<char>>(s,pcVar7,lVar5);
  return;
}

Assistant:

void Circuit::output_gate(ostream &s, unsigned int i) const {
  if (GateT[i] == INV) {
    s << "1 1 " << GateI[i][0] << " " << GateO[i][0] << " INV";
  } else if (GateT[i] == EQ) {
    s << "1 1 " << GateI[i][0] << " " << GateO[i][0] << " EQ";
  } else if (GateT[i] == EQW) {
    s << "1 1 " << GateI[i][0] << " " << GateO[i][0] << " EQW";
  } else {
    s << GateI[i].size() << " " << GateO[i].size() << " ";
    for (unsigned int j = 0; j < GateI[i].size(); j++) {
      s << GateI[i][j] << " ";
    }
    for (unsigned int j = 0; j < GateO[i].size(); j++) {
      s << GateO[i][j] << " ";
    }
    if (GateT[i] == AND) {
      s << "AND";
    } else if (GateT[i] == MAND) {
      s << "MAND";
    } else {
      s << "XOR";
    }
  }
}